

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io.c
# Opt level: O0

void bit_copy(byte_t source,byte_t *destination,int read_pos,int write_pos,int size)

{
  int local_30;
  byte_t bit_val;
  int dest_idx;
  int source_idx;
  int offset;
  int size_local;
  int write_pos_local;
  int read_pos_local;
  byte_t *destination_local;
  byte_t source_local;
  
  _write_pos_local = destination;
  for (dest_idx = 0; dest_idx < size; dest_idx = dest_idx + 1) {
    local_30 = write_pos - dest_idx;
    if (local_30 < 0) {
      local_30 = local_30 + 8;
    }
    *_write_pos_local = *_write_pos_local & ((byte)(1 << ((byte)local_30 & 0x1f)) ^ 0xff);
    *_write_pos_local =
         *_write_pos_local |
         ((byte)((int)(uint)source >> ((char)read_pos - (char)dest_idx & 0x1fU)) & 1) <<
         ((byte)local_30 & 0x1f);
    if (local_30 == 0) {
      _write_pos_local = _write_pos_local + 1;
    }
  }
  return;
}

Assistant:

void bit_copy(byte_t source, byte_t * destination, int read_pos, int write_pos, int size) {
    //TODO: need to improve, actually it's copying bit x bit...
    for(int offset=0; offset < size; offset++) {
        int source_idx = read_pos - offset;
        int dest_idx = write_pos - offset;
        if(dest_idx < 0) {
            // we have already moved to the next dest byte
            // add 8 bits to the dest_idx since it's negative now
            dest_idx += SYMBOL_BITS;
        }

        byte_t bit_val = (source >> source_idx) & SINGLE_BIT_1;  /* get bit_val from source. it will be ..00 or ..01 */
        *destination &= ~(SINGLE_BIT_1 << dest_idx);             /* set to 0 the destination bit */
        *destination |= (bit_val << dest_idx);                   /* set to bit_val the destination bit */

        if(dest_idx == 0) {
            // we have used all bits from destination, move to the next byte
            destination++;
        }
    }
}